

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::ModifyMaximalReconvergence::Process(ModifyMaximalReconvergence *this)

{
  Status SVar1;
  bool local_11;
  bool changed;
  ModifyMaximalReconvergence *this_local;
  
  if (((this->super_Pass).field_0x31 & 1) == 0) {
    local_11 = RemoveMaximalReconvergence(this);
  }
  else {
    local_11 = AddMaximalReconvergence(this);
  }
  SVar1 = SuccessWithoutChange;
  if (local_11 != false) {
    SVar1 = SuccessWithChange;
  }
  return SVar1;
}

Assistant:

Pass::Status ModifyMaximalReconvergence::Process() {
  bool changed = false;
  if (add_) {
    changed = AddMaximalReconvergence();
  } else {
    changed = RemoveMaximalReconvergence();
  }
  return changed ? Pass::Status::SuccessWithChange
                 : Pass::Status::SuccessWithoutChange;
}